

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall
flatbuffers::rust::RustGenerator::GenComment
          (RustGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dc,char *prefix)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pbVar4;
  allocator<char> local_99;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar4 = (dc->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (dc->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = prefix;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_58,&local_99);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar2;
        local_98 = (long *)*plVar1;
      }
      local_90 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)(pbVar4->_M_dataplus)._M_p);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78.field_2._8_8_ = plVar1[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_78._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      CodeWriter::operator+=(&this->code_,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (dc->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenComment(const std::vector<std::string> &dc, const char *prefix = "") {
    for (auto it = dc.begin(); it != dc.end(); it++) {
      code_ += std::string(prefix) + "///" + *it;
    }
  }